

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShellCommand.cpp
# Opt level: O2

void __thiscall
llbuild::buildsystem::ShellCommand::executeExternalCommand
          (ShellCommand *this,BuildSystem *system,TaskInterface ti,QueueJobContext *context,
          Optional<std::function<void_(llbuild::basic::ProcessResult)>_> *completionFn)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  ShellCommandHandler *pSVar4;
  HandlerState *pHVar5;
  pointer pSVar6;
  pointer pSVar7;
  pointer pcVar8;
  size_type sVar9;
  ProcessAttributes attributes;
  undefined8 uVar10;
  undefined4 uVar11;
  SmallVectorImpl<std::pair<llvm::StringRef,_llvm::StringRef>_> *pSVar12;
  void *pvVar13;
  void *pvVar14;
  _Any_data *p_Var15;
  ArrayRef<llvm::StringRef> commandLine;
  ArrayRef<std::pair<llvm::StringRef,_llvm::StringRef>_> environment;
  TaskInterface ti_local;
  undefined6 uStack_fe;
  undefined6 uStack_e6;
  _Any_data local_e0;
  code *local_d0;
  _Any_data local_c0;
  code *local_b0;
  anon_class_72_4_ab194bda commandCompletionFn;
  OptionalStorage<std::function<void_(llbuild::basic::ProcessResult)>,_false> local_58;
  
  pvVar13 = ti.ctx;
  pvVar14 = ti.impl;
  ti_local.impl = pvVar14;
  ti_local.ctx = pvVar13;
  commandCompletionFn.this = this;
  commandCompletionFn.system = system;
  commandCompletionFn.ti.impl = pvVar14;
  commandCompletionFn.ti.ctx = pvVar13;
  llvm::optional_detail::OptionalStorage<std::function<void_(llbuild::basic::ProcessResult)>,_false>
  ::OptionalStorage(&commandCompletionFn.completionFn.Storage,&completionFn->Storage);
  pSVar4 = this->handler;
  if (pSVar4 == (ShellCommandHandler *)0x0) {
    pSVar6 = (this->args).super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pSVar7 = (this->args).super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    pSVar12 = &(this->env).super_SmallVectorImpl<std::pair<llvm::StringRef,_llvm::StringRef>_>;
    uVar10 = (pSVar12->
             super_SmallVectorTemplateBase<std::pair<llvm::StringRef,_llvm::StringRef>,_true>).
             super_SmallVectorTemplateCommon<std::pair<llvm::StringRef,_llvm::StringRef>,_void>.
             super_SmallVectorBase.BeginX;
    uVar11 = (pSVar12->
             super_SmallVectorTemplateBase<std::pair<llvm::StringRef,_llvm::StringRef>,_true>).
             super_SmallVectorTemplateCommon<std::pair<llvm::StringRef,_llvm::StringRef>,_void>.
             super_SmallVectorBase.Size;
    environment.Length._0_4_ = uVar11;
    environment.Data = (pair<llvm::StringRef,_llvm::StringRef> *)uVar10;
    bVar1 = this->canSafelyInterrupt;
    pcVar8 = (this->workingDirectory)._M_dataplus._M_p;
    sVar9 = (this->workingDirectory)._M_string_length;
    bVar2 = this->inheritEnv;
    bVar3 = this->controlEnabled;
    std::function<void(llbuild::basic::ProcessResult)>::
    function<llbuild::buildsystem::ShellCommand::executeExternalCommand(llbuild::buildsystem::BuildSystem&,llbuild::core::TaskInterface,llbuild::basic::QueueJobContext*,llvm::Optional<std::function<void(llbuild::basic::ProcessResult)>>)::__0&,void>
              ((function<void(llbuild::basic::ProcessResult)> *)local_e0._M_pod_data,
               &commandCompletionFn);
    llvm::optional_detail::
    OptionalStorage<std::function<void_(llbuild::basic::ProcessResult)>,_false>::OptionalStorage
              (&local_58,(function<void_(llbuild::basic::ProcessResult)> *)&local_e0);
    attributes.connectToConsole = false;
    attributes.canSafelyInterrupt = bVar1;
    attributes._2_6_ = uStack_fe;
    attributes.controlEnabled = bVar3;
    attributes.inheritEnvironment = bVar2;
    attributes._26_6_ = uStack_e6;
    attributes.workingDir.Data = pcVar8;
    attributes.workingDir.Length = sVar9;
    commandLine.Length = (long)pSVar7 - (long)pSVar6 >> 4;
    commandLine.Data = pSVar6;
    environment.Length._4_4_ = 0;
    core::TaskInterface::spawn
              (&ti_local,context,commandLine,environment,attributes,
               (Optional<std::function<void_(llbuild::basic::ProcessResult)>_> *)&local_58,
               (ProcessDelegate *)0x0);
    llvm::optional_detail::
    OptionalStorage<std::function<void_(llbuild::basic::ProcessResult)>,_false>::reset(&local_58);
    if (local_d0 == (code *)0x0) goto LAB_00160045;
    p_Var15 = &local_e0;
    local_b0 = local_d0;
  }
  else {
    pHVar5 = (this->handlerState)._M_t.
             super___uniq_ptr_impl<llbuild::buildsystem::HandlerState,_std::default_delete<llbuild::buildsystem::HandlerState>_>
             ._M_t.
             super__Tuple_impl<0UL,_llbuild::buildsystem::HandlerState_*,_std::default_delete<llbuild::buildsystem::HandlerState>_>
             .super__Head_base<0UL,_llbuild::buildsystem::HandlerState_*,_false>._M_head_impl;
    std::function<void(llbuild::basic::ProcessResult)>::
    function<llbuild::buildsystem::ShellCommand::executeExternalCommand(llbuild::buildsystem::BuildSystem&,llbuild::core::TaskInterface,llbuild::basic::QueueJobContext*,llvm::Optional<std::function<void(llbuild::basic::ProcessResult)>>)::__0&,void>
              ((function<void(llbuild::basic::ProcessResult)> *)local_c0._M_pod_data,
               &commandCompletionFn);
    (*pSVar4->_vptr_ShellCommandHandler[3])(pSVar4,pHVar5,this,pvVar14,pvVar13,context,&local_c0);
    if (local_b0 == (code *)0x0) goto LAB_00160045;
    p_Var15 = &local_c0;
  }
  (*local_b0)(p_Var15,p_Var15,__destroy_functor);
LAB_00160045:
  llvm::optional_detail::OptionalStorage<std::function<void_(llbuild::basic::ProcessResult)>,_false>
  ::reset(&commandCompletionFn.completionFn.Storage);
  return;
}

Assistant:

void ShellCommand::executeExternalCommand(
    BuildSystem& system,
    TaskInterface ti,
    QueueJobContext* context,
    llvm::Optional<ProcessCompletionFn> completionFn) {
  auto commandCompletionFn = [this, &system, ti, completionFn](ProcessResult result) mutable {
    if (result.status != ProcessStatus::Succeeded) {
      // If the command failed, there is no need to gather dependencies.
      if (completionFn.hasValue())
        completionFn.getValue()(result);
      return;
    }

    // Collect the discovered dependencies, if used.
    if (!depsPaths.empty()) {
      ti.spawn(QueueJob{ this, [this, &system, ti, completionFn, result](QueueJobContext* context) mutable {
            if (!processDiscoveredDependencies(system, ti, context)) {
              // If we were unable to process the dependencies output, report a
              // failure.
              if (completionFn.hasValue())
                completionFn.getValue()(ProcessStatus::Failed);
              return;
            }
            if (completionFn.hasValue())
              completionFn.getValue()(result);
          }}, QueueJobPriority::High);
      return;
    }

    if (completionFn.hasValue())
      completionFn.getValue()(result);
  };
      
  // Delegate to the handler, if present.
  if (handler) {
    // FIXME: We should consider making this interface capable of feeding
    // back the dependencies directly.
    //
    // FIXME: This needs to honor certain properties of the execution queue
    // (like indicating when the work starts and stops, and communicating with
    // the execution queue delegate controlling how output is handled). It could
    // be the case that this should actually be delegating this work to run on
    // the execution queue, and the queue handles the handoff.
    handler->execute(
        handlerState.get(), this, ti, context, commandCompletionFn);
    return;
  }

  bool connectToConsole = false;

  // Execute the command.
  ti.spawn(
      context, args, env,
      {canSafelyInterrupt, connectToConsole, workingDirectory, inheritEnv, controlEnabled},
      /*completionFn=*/{commandCompletionFn});
}